

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_parser.cpp
# Opt level: O1

bool __thiscall
dxil_spv::DXILContainerParser::parse_container
          (DXILContainerParser *this,void *data,size_t size,bool reflection)

{
  bool bVar1;
  ssize_t sVar2;
  size_t sVar3;
  undefined7 in_register_00000009;
  size_t sVar4;
  Vector<DXIL::IOElement> *elements;
  DXILContainerParser *pDVar5;
  int iVar6;
  ulong uVar7;
  uint *part_offset;
  pointer puVar8;
  bool bVar9;
  PartHeader part_header;
  FourCC expected;
  Vector<uint32_t> parts;
  ContainerHeader container_header;
  MemoryStream stream;
  MemoryStream substream;
  int local_b4;
  uint local_b0;
  int local_ac;
  Vector<DXIL::IOElement> *local_a8;
  Vector<DXIL::IOElement> *local_a0;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_98;
  int local_80 [6];
  uint local_68;
  uint local_64;
  MemoryStream local_60;
  
  sVar4 = CONCAT71(in_register_00000009,reflection);
  MemoryStream::MemoryStream(&local_60,data,size);
  sVar2 = MemoryStream::read(&local_60,(int)local_80,(void *)0x20,sVar4);
  bVar9 = false;
  if ((((char)sVar2 != '\0') && (bVar9 = false, local_80[0] == 0x43425844)) && (local_68 <= size)) {
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_98,(ulong)local_64,(allocator_type *)&stack0xffffffffffffffb8);
    if (local_64 != 0) {
      iVar6 = 0;
      uVar7 = 0;
      do {
        sVar2 = MemoryStream::read(&local_60,
                                   (int)local_98.
                                        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start + iVar6,
                                   (void *)0x4,sVar4);
        if ((char)sVar2 == '\0') {
          bVar9 = false;
          goto LAB_0014df4f;
        }
        uVar7 = uVar7 + 1;
        iVar6 = iVar6 + 4;
      } while (uVar7 < local_64);
    }
    bVar9 = local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    if (!bVar9) {
      local_a0 = &this->output_elements;
      sVar4 = 0x4c495844;
      if (reflection) {
        sVar4 = 0x54415453;
      }
      local_ac = (int)sVar4;
      local_a8 = &this->input_elements;
      puVar8 = local_98.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        bVar1 = MemoryStream::seek(&local_60,(ulong)*puVar8);
        if ((!bVar1) ||
           (sVar2 = MemoryStream::read(&local_60,(int)&local_b4,(void *)0x8,sVar4),
           (char)sVar2 == '\0')) break;
        if (local_b4 < 0x4c495844) {
          pDVar5 = (DXILContainerParser *)&stack0xffffffffffffffb8;
          if (local_b4 == 0x31475349) {
            sVar3 = MemoryStream::get_offset(&local_60);
            sVar4 = (size_t)local_b0;
            MemoryStream::create_substream
                      ((MemoryStream *)&stack0xffffffffffffffb8,&local_60,sVar3,sVar4);
            elements = local_a8;
LAB_0014df31:
            bVar1 = parse_iosg1(pDVar5,(MemoryStream *)&stack0xffffffffffffffb8,elements);
            goto LAB_0014df36;
          }
          if (local_b4 == 0x3147534f) {
            sVar3 = MemoryStream::get_offset(&local_60);
            sVar4 = (size_t)local_b0;
            MemoryStream::create_substream
                      ((MemoryStream *)&stack0xffffffffffffffb8,&local_60,sVar3,sVar4);
            elements = local_a0;
            goto LAB_0014df31;
          }
        }
        else {
          if (local_b4 != 0x54415453) {
            if (local_b4 == 0x54414452) {
              sVar3 = MemoryStream::get_offset(&local_60);
              sVar4 = (size_t)local_b0;
              MemoryStream::create_substream
                        ((MemoryStream *)&stack0xffffffffffffffb8,&local_60,sVar3,sVar4);
              bVar1 = parse_rdat(this,(MemoryStream *)&stack0xffffffffffffffb8);
              goto LAB_0014df36;
            }
            if (local_b4 != 0x4c495844) goto LAB_0014df3a;
          }
          if (local_ac == local_b4) {
            sVar3 = MemoryStream::get_offset(&local_60);
            sVar4 = (size_t)local_b0;
            MemoryStream::create_substream
                      ((MemoryStream *)&stack0xffffffffffffffb8,&local_60,sVar3,sVar4);
            bVar1 = parse_dxil(this,(MemoryStream *)&stack0xffffffffffffffb8);
LAB_0014df36:
            if (bVar1 == false) break;
          }
        }
LAB_0014df3a:
        puVar8 = puVar8 + 1;
        bVar9 = puVar8 == local_98.
                          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
      } while (!bVar9);
    }
LAB_0014df4f:
    if (local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (uint *)0x0) {
      free_in_thread(local_98.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar9;
}

Assistant:

bool DXILContainerParser::parse_container(const void *data, size_t size, bool reflection)
{
	MemoryStream stream(data, size);

	DXIL::ContainerHeader container_header;
	if (!stream.read(container_header))
		return false;

	if (static_cast<DXIL::FourCC>(container_header.header_fourcc) != DXIL::FourCC::Container)
		return false;
	if (container_header.container_size_in_bytes > size)
		return false;

	Vector<uint32_t> parts(container_header.part_count);
	for (uint32_t i = 0; i < container_header.part_count; i++)
	{
		if (!stream.read(parts[i]))
			return false;
	}

	for (auto &part_offset : parts)
	{
		if (!stream.seek(part_offset))
			return false;

		DXIL::PartHeader part_header;
		if (!stream.read(part_header))
			return false;

		auto fourcc = static_cast<DXIL::FourCC>(part_header.part_fourcc);
		switch (fourcc)
		{
		case DXIL::FourCC::DXIL:
		case DXIL::FourCC::ShaderStatistics:
		{
			DXIL::FourCC expected = reflection ? DXIL::FourCC::ShaderStatistics : DXIL::FourCC::DXIL;
			if (expected != fourcc)
				break;

			// The STAT block includes a DXIL blob that is literally the same DXIL IR
			// minus code + string names in the metadata chunks ... <__________________________________<
			auto substream = stream.create_substream(stream.get_offset(), part_header.part_size);
			if (!parse_dxil(substream))
				return false;
			break;
		}

		case DXIL::FourCC::FeatureInfo:
			break;

		case DXIL::FourCC::InputSignature:
		{
			auto substream = stream.create_substream(stream.get_offset(), part_header.part_size);
			if (!parse_iosg1(substream, input_elements))
				return false;
			break;
		}

		case DXIL::FourCC::OutputSignature:
		{
			auto substream = stream.create_substream(stream.get_offset(), part_header.part_size);
			if (!parse_iosg1(substream, output_elements))
				return false;
			break;
		}

		case DXIL::FourCC::PatchConstantSignature:
			break;

		case DXIL::FourCC::PrivateData:
			break;

		case DXIL::FourCC::RootSignature:
			break;

		case DXIL::FourCC::PipelineStateValidation:
			break;

		case DXIL::FourCC::ResourceDef:
			break;

		case DXIL::FourCC::ShaderHash:
			break;

		case DXIL::FourCC::RuntimeData:
		{
			auto substream = stream.create_substream(stream.get_offset(), part_header.part_size);
			if (!parse_rdat(substream))
				return false;
			break;
		}

		default:
			break;
		}
	}

	return true;
}